

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFF_Layer2.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::IFF_Layer2::Encode(IFF_Layer2 *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *stream_00;
  pointer pIVar2;
  __normal_iterator<const_KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_*,_std::vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  IFF_Layer2 *this_local;
  
  LayerHeader::Encode(&this->super_LayerHeader,stream);
  stream_00 = DATA_TYPE::operator<<(stream,&(this->m_BmDt).super_DataTypeBase);
  DATA_TYPE::operator<<(stream_00,&(this->m_SOD).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
            ::begin(&this->m_vFPD);
  local_28._M_current =
       (IFF_ATC_NAVAIDS_FundamentalParameterData *)
       std::
       vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>
       ::end(&this->m_vFPD);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pIVar2 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_*,_std::vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>_>
             ::operator->(&citrEnd);
    (*(pIVar2->super_DataTypeBase)._vptr_DataTypeBase[5])(pIVar2,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData_*,_std::vector<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData,_std::allocator<KDIS::DATA_TYPE::IFF_ATC_NAVAIDS_FundamentalParameterData>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void IFF_Layer2::Encode( KDataStream & stream ) const
{
	LayerHeader::Encode( stream );

    stream << KDIS_STREAM m_BmDt
           << KDIS_STREAM m_SOD;

    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citr = m_vFPD.begin();
    vector<IFF_ATC_NAVAIDS_FundamentalParameterData>::const_iterator citrEnd = m_vFPD.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}